

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

bool __thiscall cmCacheManager::SaveCache(cmCacheManager *this,string *path,cmMessenger *messenger)

{
  CacheEntry *pCVar1;
  _Base_ptr *pp_Var2;
  CacheEntryType type;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  string *psVar6;
  cmValue cVar7;
  cmCacheManager *pcVar8;
  cmCacheManager *pcVar9;
  cmCacheManager *pcVar10;
  bool bVar11;
  cmAlphaNum local_540;
  cmCacheManager *local_510;
  string currentcwd;
  string checkCacheFile;
  string cacheFile;
  ofstream checkCache;
  cmGeneratedFileStream fout;
  
  fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (path->_M_dataplus)._M_p;
  fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)path->_M_string_length;
  checkCache.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0xf;
  checkCache.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = anon_var_dwarf_459ad6;
  cmStrCat<>(&cacheFile,(cmAlphaNum *)&fout,(cmAlphaNum *)&checkCache);
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,&cacheFile,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent(&fout,true);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&checkCache,"CMAKE_CACHE_MAJOR_VERSION",(allocator<char> *)&currentcwd);
    uVar4 = cmVersion::GetMajorVersion();
    std::__cxx11::to_string((string *)&local_540,uVar4);
    AddCacheEntry(this,(string *)&checkCache,(string *)&local_540,
                  "Major version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&checkCache);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&checkCache,"CMAKE_CACHE_MINOR_VERSION",(allocator<char> *)&currentcwd);
    uVar4 = cmVersion::GetMinorVersion();
    std::__cxx11::to_string((string *)&local_540,uVar4);
    AddCacheEntry(this,(string *)&checkCache,(string *)&local_540,
                  "Minor version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&checkCache);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&checkCache,"CMAKE_CACHE_PATCH_VERSION",(allocator<char> *)&currentcwd);
    uVar4 = cmVersion::GetPatchVersion();
    std::__cxx11::to_string((string *)&local_540,uVar4);
    AddCacheEntry(this,(string *)&checkCache,(string *)&local_540,
                  "Patch version of cmake used to create the current loaded cache",INTERNAL);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&checkCache);
    std::__cxx11::string::string((string *)&currentcwd,(string *)path);
    if (((byte)(*currentcwd._M_dataplus._M_p + 0xbfU) < 0x1a) &&
       (currentcwd._M_dataplus._M_p[1] == ':')) {
      *currentcwd._M_dataplus._M_p = *currentcwd._M_dataplus._M_p | 0x20;
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&currentcwd);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&checkCache,"CMAKE_CACHEFILE_DIR",(allocator<char> *)&local_540);
    AddCacheEntry(this,(string *)&checkCache,&currentcwd,
                  "This is the directory where this CMakeCache.txt was created",INTERNAL);
    std::__cxx11::string::~string((string *)&checkCache);
    poVar5 = std::operator<<((ostream *)&fout,
                             "# This is the CMakeCache file.\n# For build in directory: ");
    poVar5 = std::operator<<(poVar5,(string *)&currentcwd);
    poVar5 = std::operator<<(poVar5,"\n# It was generated by CMake: ");
    psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,(string *)psVar6);
    std::operator<<(poVar5,
                    "\n# You can edit this file to change values found and used by cmake.\n# If you do not want to change any of the values, simply exit the editor.\n# If you do want to change a value, simply edit, save, and exit the editor.\n# The syntax for the file is as follows:\n# KEY:TYPE=VALUE\n# KEY is the name of a variable in the cache.\n# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT TYPE!.\n# VALUE is the current value for the KEY.\n\n########################\n# EXTERNAL cache entries\n########################\n\n"
                   );
    local_510 = (cmCacheManager *)&(this->Cache)._M_t._M_impl.super__Rb_tree_header;
    for (pcVar8 = (cmCacheManager *)
                  (this->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pcVar8 != local_510;
        pcVar8 = (cmCacheManager *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar8)) {
      type = *(CacheEntryType *)
              &pcVar8[1].Cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      if ((type != INTERNAL &
          *(byte *)&pcVar8[2].Cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right) == 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&checkCache,"HELPSTRING",(allocator<char> *)&local_540);
        pCVar1 = (CacheEntry *)(pcVar8 + 1);
        cVar7 = CacheEntry::GetProperty(pCVar1,(string *)&checkCache);
        std::__cxx11::string::~string((string *)&checkCache);
        if (cVar7.Value == (string *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&checkCache,"Missing description",(allocator<char> *)&local_540);
          OutputHelpString((ostream *)&fout,(string *)&checkCache);
          std::__cxx11::string::~string((string *)&checkCache);
        }
        else {
          OutputHelpString((ostream *)&fout,cVar7.Value);
        }
        pp_Var2 = &(pcVar8->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        OutputKey((ostream *)&fout,(string *)pp_Var2);
        poVar5 = std::operator<<((ostream *)&fout,':');
        psVar6 = cmState::CacheEntryTypeToString_abi_cxx11_(type);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        std::operator<<(poVar5,'=');
        OutputValue((ostream *)&fout,(string *)pCVar1);
        std::operator<<((ostream *)&fout,'\n');
        OutputNewlineTruncationWarning
                  ((ostream *)&fout,(string *)pp_Var2,(string *)pCVar1,messenger);
        std::operator<<((ostream *)&fout,'\n');
      }
    }
    pcVar8 = (cmCacheManager *)&fout;
    std::operator<<((ostream *)pcVar8,
                    "\n########################\n# INTERNAL cache entries\n########################\n\n"
                   );
    pcVar10 = (cmCacheManager *)(this->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (pcVar10 != local_510) {
      if (*(char *)&pcVar10[2].Cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right == '\x01'
         ) {
        pp_Var2 = &(pcVar10->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        pCVar1 = (CacheEntry *)(pcVar10 + 1);
        iVar3 = *(int *)&pcVar10[1].Cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        WritePropertyEntries(pcVar8,(ostream *)&fout,(string *)pp_Var2,pCVar1,messenger);
        if (iVar3 == 4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&checkCache,"HELPSTRING",(allocator<char> *)&local_540);
          cVar7 = CacheEntry::GetProperty(pCVar1,(string *)&checkCache);
          std::__cxx11::string::~string((string *)&checkCache);
          if (cVar7.Value != (string *)0x0) {
            OutputHelpString((ostream *)&fout,cVar7.Value);
          }
          OutputKey((ostream *)&fout,(string *)pp_Var2);
          poVar5 = std::operator<<((ostream *)&fout,':');
          psVar6 = cmState::CacheEntryTypeToString_abi_cxx11_(INTERNAL);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          std::operator<<(poVar5,'=');
          OutputValue((ostream *)&fout,(string *)pCVar1);
          std::operator<<((ostream *)&fout,'\n');
          OutputNewlineTruncationWarning
                    ((ostream *)&fout,(string *)pp_Var2,(string *)pCVar1,messenger);
        }
      }
      pcVar9 = (cmCacheManager *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar10);
      pcVar8 = pcVar10;
      pcVar10 = pcVar9;
    }
    std::operator<<((ostream *)&fout,'\n');
    cmGeneratedFileStream::Close(&fout);
    checkCache.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = (path->_M_dataplus)._M_p;
    checkCache.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)path->_M_string_length;
    local_540.View_._M_len = (size_t)&DAT_0000000b;
    local_540.View_._M_str = "/CMakeFiles";
    cmStrCat<>(&checkCacheFile,(cmAlphaNum *)&checkCache,&local_540);
    cmsys::SystemTools::MakeDirectory(&checkCacheFile,(mode_t *)0x0);
    std::__cxx11::string::append((char *)&checkCacheFile);
    std::ofstream::ofstream(&checkCache,checkCacheFile._M_dataplus._M_p,_S_out);
    bVar11 = ((&checkCache.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
              [(long)checkCache.super_basic_ostream<char,_std::char_traits<char>_>.
                     _vptr_basic_ostream[-3]] & 5) == 0;
    if (bVar11) {
      std::operator<<(&checkCache.super_basic_ostream<char,_std::char_traits<char>_>,
                      "# This file is generated by cmake for dependency checking of the CMakeCache.txt file\n"
                     );
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_540
                     ,"Unable to open check cache file for write. ",&checkCacheFile);
      cmSystemTools::Error((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_540);
    }
    std::ofstream::~ofstream(&checkCache);
    std::__cxx11::string::~string((string *)&checkCacheFile);
    std::__cxx11::string::~string((string *)&currentcwd);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&checkCache,
                   "Unable to open cache file for save. ",&cacheFile);
    cmSystemTools::Error((string *)&checkCache);
    std::__cxx11::string::~string((string *)&checkCache);
    cmSystemTools::ReportLastSystemError("");
    bVar11 = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  std::__cxx11::string::~string((string *)&cacheFile);
  return bVar11;
}

Assistant:

bool cmCacheManager::SaveCache(const std::string& path, cmMessenger* messenger)
{
  std::string cacheFile = cmStrCat(path, "/CMakeCache.txt");
  cmGeneratedFileStream fout(cacheFile);
  fout.SetCopyIfDifferent(true);
  if (!fout) {
    cmSystemTools::Error("Unable to open cache file for save. " + cacheFile);
    cmSystemTools::ReportLastSystemError("");
    return false;
  }
  // before writing the cache, update the version numbers
  // to the
  this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION",
                      std::to_string(cmVersion::GetMajorVersion()),
                      "Major version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION",
                      std::to_string(cmVersion::GetMinorVersion()),
                      "Minor version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CACHE_PATCH_VERSION",
                      std::to_string(cmVersion::GetPatchVersion()),
                      "Patch version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);

  // Let us store the current working directory so that if somebody
  // Copies it, he will not be surprised
  std::string currentcwd = path;
  if (currentcwd[0] >= 'A' && currentcwd[0] <= 'Z' && currentcwd[1] == ':') {
    // Cast added to avoid compiler warning. Cast is ok because
    // value is guaranteed to fit in char by the above if...
    currentcwd[0] = static_cast<char>(currentcwd[0] - 'A' + 'a');
  }
  cmSystemTools::ConvertToUnixSlashes(currentcwd);
  this->AddCacheEntry("CMAKE_CACHEFILE_DIR", currentcwd,
                      "This is the directory where this CMakeCache.txt"
                      " was created",
                      cmStateEnums::INTERNAL);

  /* clang-format off */
  fout << "# This is the CMakeCache file.\n"
          "# For build in directory: " << currentcwd << "\n"
          "# It was generated by CMake: "
       << cmSystemTools::GetCMakeCommand()
       << "\n"
          "# You can edit this file to change values found and used by cmake."
          "\n"
          "# If you do not want to change any of the values, simply exit the "
          "editor.\n"
          "# If you do want to change a value, simply edit, save, and exit "
          "the editor.\n"
          "# The syntax for the file is as follows:\n"
          "# KEY:TYPE=VALUE\n"
          "# KEY is the name of a variable in the cache.\n"
          "# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT TYPE!."
          "\n"
          "# VALUE is the current value for the KEY.\n"
          "\n"
          "########################\n"
          "# EXTERNAL cache entries\n"
          "########################\n"
          "\n";
  /* clang-format on */

  for (auto const& i : this->Cache) {
    CacheEntry const& ce = i.second;
    cmStateEnums::CacheEntryType t = ce.Type;
    if (!ce.Initialized) {
      /*
        // This should be added in, but is not for now.
      cmSystemTools::Error("Cache entry \"" + i.first + "\" is uninitialized");
      */
    } else if (t != cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (cmValue help = ce.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, *help);
      } else {
        cmCacheManager::OutputHelpString(fout, "Missing description");
      }
      cmCacheManager::OutputKey(fout, i.first);
      fout << ':' << cmState::CacheEntryTypeToString(t) << '=';
      cmCacheManager::OutputValue(fout, ce.Value);
      fout << '\n';
      cmCacheManager::OutputNewlineTruncationWarning(fout, i.first, ce.Value,
                                                     messenger);
      fout << '\n';
    }
  }

  fout << "\n"
          "########################\n"
          "# INTERNAL cache entries\n"
          "########################\n"
          "\n";

  for (auto const& i : this->Cache) {
    if (!i.second.Initialized) {
      continue;
    }

    cmStateEnums::CacheEntryType t = i.second.GetType();
    this->WritePropertyEntries(fout, i.first, i.second, messenger);
    if (t == cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (cmValue help = i.second.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, *help);
      }
      cmCacheManager::OutputKey(fout, i.first);
      fout << ':' << cmState::CacheEntryTypeToString(t) << '=';
      cmCacheManager::OutputValue(fout, i.second.GetValue());
      fout << '\n';
      cmCacheManager::OutputNewlineTruncationWarning(
        fout, i.first, i.second.GetValue(), messenger);
    }
  }
  fout << '\n';
  fout.Close();
  std::string checkCacheFile = cmStrCat(path, "/CMakeFiles");
  cmSystemTools::MakeDirectory(checkCacheFile);
  checkCacheFile += "/cmake.check_cache";
  cmsys::ofstream checkCache(checkCacheFile.c_str());
  if (!checkCache) {
    cmSystemTools::Error("Unable to open check cache file for write. " +
                         checkCacheFile);
    return false;
  }
  checkCache << "# This file is generated by cmake for dependency checking "
                "of the CMakeCache.txt file\n";
  return true;
}